

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O3

void __thiscall
embree::Instantiator::instantiate(Instantiator *this,Ref<embree::SceneGraph::GroupNode> *group)

{
  element_type *peVar1;
  GroupNode *pGVar2;
  int iVar3;
  int iVar4;
  TransformNode *this_00;
  ulong uVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  undefined1 auVar10 [16];
  float fVar11;
  undefined1 auVar12 [16];
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  __m128 r;
  AffineSpace3fa space;
  anon_union_8_2_4062524c_for_Vec2<float>_1 local_100;
  float local_f4;
  float local_f0;
  float local_ec;
  anon_union_8_2_4062524c_for_Vec2<float>_1 local_e8;
  undefined8 local_e0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_d8;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined1 local_98 [16];
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  if (this->N != 0) {
    uVar5 = 0;
    auVar8._0_12_ = ZEXT812(0x3f800000);
    auVar8._12_4_ = 0;
    local_98 = rsqrtss(auVar8,auVar8);
    local_f0 = local_98._0_4_ * 1.5;
    local_f4 = local_98._0_4_ * -0.5;
    do {
      iVar3 = rand();
      iVar4 = rand();
      local_e0 = CONCAT44((float)iVar4 * 4.656613e-10,(float)iVar3 * 4.656613e-10);
      Distribution2D::sample
                ((Distribution2D *)&local_100.field_0,
                 (Vec2f *)(this->dist).
                          super___shared_ptr<embree::Distribution2D,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr);
      peVar1 = (this->dist).super___shared_ptr<embree::Distribution2D,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      auVar7._0_4_ = (float)peVar1->height;
      auVar10._0_4_ = (float)peVar1->width;
      auVar10._4_4_ = auVar7._0_4_;
      auVar10._8_8_ = 0;
      auVar12._4_4_ = auVar7._0_4_;
      auVar12._0_4_ = auVar10._0_4_;
      auVar12._8_8_ = 0;
      auVar12 = rcpss(auVar12,auVar10);
      auVar7._4_4_ = auVar7._0_4_;
      auVar7._8_4_ = auVar7._0_4_;
      auVar7._12_4_ = auVar7._0_4_;
      auVar8 = rcpss(auVar7,auVar7);
      fVar6 = local_100.field_0.y;
      local_100._0_4_ = local_100.field_0.x * (2.0 - auVar10._0_4_ * auVar12._0_4_) * auVar12._0_4_;
      local_100._4_4_ = fVar6 * (2.0 - auVar7._0_4_ * auVar8._0_4_) * auVar8._0_4_;
      iVar3 = rand();
      fVar6 = (float)iVar3 * 4.656613e-10 * 6.2831855;
      local_e8 = local_100;
      HeightField::get((AffineSpace3fa *)&local_d8.field_1,(this->heightField).ptr,
                       (Vec2f *)&local_e8.field_0);
      fStack_7c = (float)local_98._0_4_ * (float)local_98._0_4_ * local_f4 + local_f0;
      local_88 = fStack_7c * 0.0;
      fStack_84 = fStack_7c * 1.0;
      fStack_80 = fStack_7c * 0.0;
      fStack_7c = fStack_7c * 0.0;
      local_ec = sinf(fVar6);
      fVar6 = cosf(fVar6);
      fVar9 = (1.0 - local_88 * local_88) * fVar6 + local_88 * local_88;
      fVar18 = 1.0 - fVar6;
      fVar14 = local_88 * fStack_84 * fVar18;
      fVar11 = fVar14 - local_ec * fStack_80;
      fVar17 = local_88 * fStack_80 * fVar18;
      fVar13 = fVar17 + local_ec * fStack_84;
      fVar14 = local_ec * fStack_80 + fVar14;
      fVar16 = (1.0 - fStack_84 * fStack_84) * fVar6 + fStack_84 * fStack_84;
      fVar18 = fStack_84 * fStack_80 * fVar18;
      fVar15 = fVar18 - local_88 * local_ec;
      fVar17 = fVar17 - local_ec * fStack_84;
      fVar18 = local_88 * local_ec + fVar18;
      fVar6 = (1.0 - fStack_80 * fStack_80) * fVar6 + fStack_80 * fStack_80;
      local_78.m128[0] = fVar9 * local_d8.m128[0] + fVar14 * local_c8 + fVar17 * local_b8;
      local_78.m128[1] = fVar9 * local_d8.m128[1] + fVar14 * fStack_c4 + fVar17 * fStack_b4;
      local_78.m128[2] = fVar9 * local_d8.m128[2] + fVar14 * fStack_c0 + fVar17 * fStack_b0;
      local_78.m128[3] = fVar9 * local_d8.m128[3] + fVar14 * fStack_bc + fVar17 * fStack_ac;
      local_68 = fVar11 * local_d8.m128[0] + fVar16 * local_c8 + fVar18 * local_b8;
      fStack_64 = fVar11 * local_d8.m128[1] + fVar16 * fStack_c4 + fVar18 * fStack_b4;
      fStack_60 = fVar11 * local_d8.m128[2] + fVar16 * fStack_c0 + fVar18 * fStack_b0;
      fStack_5c = fVar11 * local_d8.m128[3] + fVar16 * fStack_bc + fVar18 * fStack_ac;
      local_58 = fVar13 * local_d8.m128[0] + fVar15 * local_c8 + fVar6 * local_b8;
      fStack_54 = fVar13 * local_d8.m128[1] + fVar15 * fStack_c4 + fVar6 * fStack_b4;
      fStack_50 = fVar13 * local_d8.m128[2] + fVar15 * fStack_c0 + fVar6 * fStack_b0;
      fStack_4c = fVar13 * local_d8.m128[3] + fVar15 * fStack_bc + fVar6 * fStack_ac;
      local_48 = local_d8.m128[0] * 0.0 + local_c8 * 0.0 + local_b8 * 0.0 + local_a8;
      fStack_44 = local_d8.m128[1] * 0.0 + fStack_c4 * 0.0 + fStack_b4 * 0.0 + fStack_a4;
      fStack_40 = local_d8.m128[2] * 0.0 + fStack_c0 * 0.0 + fStack_b0 * 0.0 + fStack_a0;
      fStack_3c = local_d8.m128[3] * 0.0 + fStack_bc * 0.0 + fStack_ac * 0.0 + fStack_9c;
      pGVar2 = group->ptr;
      this_00 = (TransformNode *)alignedMalloc(0xa0,0x10);
      SceneGraph::TransformNode::TransformNode
                (this_00,(AffineSpace3fa *)&local_78.field_1,&this->object);
      local_d8._0_8_ = this_00;
      (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
      if (((TransformNode *)local_d8._0_8_ != (TransformNode *)0x0) &&
         (std::
          vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
          ::push_back(&pGVar2->children,(value_type *)&local_d8.field_1),
         (TransformNode *)local_d8._0_8_ != (TransformNode *)0x0)) {
        (**(code **)(*(long *)local_d8._0_8_ + 0x18))();
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < this->N);
  }
  return;
}

Assistant:

void instantiate(Ref<SceneGraph::GroupNode>& group) 
    {
      for (size_t i=0; i<N; i++) 
      {
        Vec2f r = Vec2f(random<float>(),random<float>());
        Vec2f p = dist->sample(r);
        p.x *= rcp(float(dist->width)); p.y *= rcp(float(dist->height));
        float angle = 2.0f*float(pi)*random<float>();
        const AffineSpace3fa space = heightField->get(p)*AffineSpace3fa::rotate(Vec3fa(0,1,0),angle);
        group->add(new SceneGraph::TransformNode(space,object));
      }
    }